

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O1

void proc_pool_join(ProcPool *pool)

{
  int32_t iVar1;
  int iVar2;
  int32_t i;
  long lVar3;
  char **ppcVar4;
  long lVar5;
  
  do {
    iVar1 = pool_sync2(pool);
  } while (-1 < iVar1);
  if (0 < pool->max_num_procs) {
    ppcVar4 = pool->procs[0].args;
    lVar5 = 0;
    do {
      if (pool->procs[lVar5].valid == true) {
        pool->procs[lVar5].pid = -0x80000000;
        lVar3 = 0;
        do {
          free(ppcVar4[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x100);
        memset(pool->procs + lVar5,0,0x810);
      }
      lVar5 = lVar5 + 1;
      iVar2 = pool->max_num_procs;
      if (0xf < iVar2) {
        iVar2 = 0x10;
      }
      ppcVar4 = ppcVar4 + 0x102;
    } while (lVar5 < iVar2);
  }
  return;
}

Assistant:

void proc_pool_join(ProcPool *pool) {
    while ((pool_sync2(pool) >= 0)) {
    }

    // NOTE: Technically this loop is not necessary since `pool_sync` will take
    //       care of destroying terminated process. But we live it here for
    //       the sake of clarity
    for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
         idx++) {
        if (pool->procs[idx].valid) {
            proc_destroy(&pool->procs[idx]);
        }
    }
}